

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_platform.cpp
# Opt level: O0

int vsprintf_s(char *buffer,size_t sizeOfBuffer,char *format,__va_list_tag *args)

{
  __gnuc_va_list in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  int c;
  int local_30;
  int local_4;
  
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    local_30 = vsnprintf(in_RDI,in_RSI,in_RDX,in_RCX);
    in_RDI[in_RSI - 1] = '\0';
    local_4 = (int)in_RSI;
    if (local_30 < 0) {
      local_4 = local_4 + -1;
    }
    else {
      if (local_4 + -1 <= local_30) {
        local_30 = local_4 + -1;
      }
      local_4 = local_30;
    }
  }
  return local_4;
}

Assistant:

int vsprintf_s(char *buffer, size_t sizeOfBuffer, const char *format, va_list args)
{
   if (!sizeOfBuffer)
      return 0;

   int c = vsnprintf(buffer, sizeOfBuffer, format, args);

   buffer[sizeOfBuffer - 1] = '\0';

   if (c < 0)
      return static_cast<int>(sizeOfBuffer - 1);

   return LZHAM_MIN(c, (int)sizeOfBuffer - 1);
}